

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

ValidateXrFlagsResult ValidateXrFoveationDynamicFlagsHTC(XrFlags64 value)

{
  ValidateXrFlagsResult VVar1;
  
  VVar1 = (value < 8) + VALIDATE_XR_FLAGS_INVALID;
  if (value == 0) {
    VVar1 = VALIDATE_XR_FLAGS_ZERO;
  }
  return VVar1;
}

Assistant:

ValidateXrFlagsResult ValidateXrFoveationDynamicFlagsHTC(const XrFlags64 value) {
    if (0 == value) {
        return VALIDATE_XR_FLAGS_ZERO;
    }
    XrFlags64 int_value = value;
    if ((int_value & XR_FOVEATION_DYNAMIC_LEVEL_ENABLED_BIT_HTC) != 0) {
        // Clear the value XR_FOVEATION_DYNAMIC_LEVEL_ENABLED_BIT_HTC since it is valid
        int_value &= ~XR_FOVEATION_DYNAMIC_LEVEL_ENABLED_BIT_HTC;
    }
    if ((int_value & XR_FOVEATION_DYNAMIC_CLEAR_FOV_ENABLED_BIT_HTC) != 0) {
        // Clear the value XR_FOVEATION_DYNAMIC_CLEAR_FOV_ENABLED_BIT_HTC since it is valid
        int_value &= ~XR_FOVEATION_DYNAMIC_CLEAR_FOV_ENABLED_BIT_HTC;
    }
    if ((int_value & XR_FOVEATION_DYNAMIC_FOCAL_CENTER_OFFSET_ENABLED_BIT_HTC) != 0) {
        // Clear the value XR_FOVEATION_DYNAMIC_FOCAL_CENTER_OFFSET_ENABLED_BIT_HTC since it is valid
        int_value &= ~XR_FOVEATION_DYNAMIC_FOCAL_CENTER_OFFSET_ENABLED_BIT_HTC;
    }
    if (int_value != 0) {
        // Something is left, it must be invalid
        return VALIDATE_XR_FLAGS_INVALID;
    }
    return VALIDATE_XR_FLAGS_SUCCESS;
}